

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void crnlib::vector<std::pair<crnlib::vec<16U,_float>,_unsigned_int>_>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  void *pvVar1;
  uint i;
  long lVar2;
  
  if (num != 0) {
    pvVar1 = (void *)((ulong)num * 0x44 + (long)pSrc_void);
    do {
      lVar2 = 0;
      do {
        *(undefined4 *)((long)pDst_void + lVar2 * 4) = *(undefined4 *)((long)pSrc_void + lVar2 * 4);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x10);
      *(undefined4 *)((long)pDst_void + 0x40) = *(undefined4 *)((long)pSrc_void + 0x40);
      pSrc_void = (void *)((long)pSrc_void + 0x44);
      pDst_void = (void *)((long)pDst_void + 0x44);
    } while (pSrc_void != pvVar1);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }